

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-sec-utils.c
# Opt level: O2

int encodeSignatureBits(uint8_t *sig)

{
  uint8_t *integer;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  size_t __n;
  uint8_t *puVar6;
  
  integer = sig + 0x28;
  iVar4 = determineAsn1IntLength(sig + 8);
  iVar5 = determineAsn1IntLength(integer);
  *sig = '0';
  sig[1] = (uint8_t)iVar5 + (uint8_t)iVar4 + '\x04';
  sig[2] = '\x02';
  sig[3] = (uint8_t)iVar4;
  if (iVar4 == 0x21) {
    sig[4] = '\0';
    *(undefined8 *)(sig + 0x15) = *(undefined8 *)(sig + 0x18);
    *(undefined8 *)(sig + 0x1d) = *(undefined8 *)(sig + 0x20);
    *(undefined8 *)(sig + 5) = *(undefined8 *)(sig + 8);
    *(undefined8 *)(sig + 0xd) = *(undefined8 *)(sig + 0x10);
    puVar6 = sig + 0x25;
  }
  else {
    __n = (size_t)iVar4;
    memmove(sig + 4,integer + -__n,__n);
    puVar6 = sig + 4 + __n;
  }
  *puVar6 = '\x02';
  puVar6[1] = (uint8_t)iVar5;
  if (iVar5 == 0x21) {
    puVar6[2] = '\0';
    uVar1 = *(undefined8 *)integer;
    uVar2 = *(undefined8 *)(sig + 0x30);
    uVar3 = *(undefined8 *)(sig + 0x40);
    *(undefined8 *)(puVar6 + 0x13) = *(undefined8 *)(sig + 0x38);
    *(undefined8 *)(puVar6 + 0x1b) = uVar3;
    *(undefined8 *)(puVar6 + 3) = uVar1;
    *(undefined8 *)(puVar6 + 0xb) = uVar2;
    iVar5 = (int)puVar6 + 0x23;
  }
  else {
    memmove(puVar6 + 2,sig + (0x48 - (long)iVar5),(long)iVar5);
    iVar5 = (int)(puVar6 + 2) + iVar5;
  }
  return iVar5 - (int)sig;
}

Assistant:

static int
encodeSignatureBits(uint8_t* sig)
{
  const uint8_t* begin = sig;
  const uint8_t* r = sig + 8;
  const uint8_t* s = r + 32;
  int rLength = determineAsn1IntLength(r);
  int sLength = determineAsn1IntLength(s);

  *(sig++) = ASN1_SEQUENCE;
  *(sig++) = 2 + rLength + 2 + sLength;
  sig = writeAsn1Int(sig, r, rLength);
  sig = writeAsn1Int(sig, s, sLength);

  return sig - begin;
}